

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O2

void mult_verify::MultVerifyInt8Int8(void)

{
  char rhs;
  char cVar1;
  long lVar2;
  allocator local_51;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 2; lVar2 != 0x1bb; lVar2 = lVar2 + 3) {
    cVar1 = *(char *)(lVar2 + 0x1898ae);
    rhs = *(char *)(lVar2 + 0x1898af);
    if ((bool)(&int8_int8)[lVar2] != ((int)(char)((int)rhs * (int)cVar1) == (int)rhs * (int)cVar1))
    {
      std::__cxx11::string::string((string *)&si,"Error in case int8_int8: ",&local_51);
      err_msg<unsigned_int,unsigned_int>
                ((string *)&si,(int)*(char *)(lVar2 + 0x1898ae),(int)*(char *)(lVar2 + 0x1898af),
                 (bool)(&int8_int8)[lVar2]);
      std::__cxx11::string::~string((string *)&si);
      cVar1 = *(char *)(lVar2 + 0x1898ae);
      rhs = *(char *)(lVar2 + 0x1898af);
    }
    si.m_int = cVar1;
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator*=((SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&si,rhs);
    if ((&int8_int8)[lVar2] != '\x01') {
      std::__cxx11::string::string((string *)&si,"Error in case int8_int8 throw: ",&local_51);
      err_msg<unsigned_int,unsigned_int>
                ((string *)&si,(int)*(char *)(lVar2 + 0x1898ae),(int)*(char *)(lVar2 + 0x1898af),
                 (bool)(&int8_int8)[lVar2]);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void MultVerifyInt8Int8()
{
	size_t i;

	for( i = 0; i < COUNTOF(int8_int8); ++i )
	{
		std::int8_t ret;
		if( SafeMultiply(int8_int8[i].x, int8_int8[i].y, ret) != int8_int8[i].fExpected )
		{
			//assert(false);
			err_msg( "Error in case int8_int8: ", (unsigned int)int8_int8[i].x, (unsigned int)int8_int8[i].y, int8_int8[i].fExpected );
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<std::int8_t> si(int8_int8[i].x);
			si *= int8_int8[i].y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != int8_int8[i].fExpected )
		{
			err_msg( "Error in case int8_int8 throw: ", (unsigned int)int8_int8[i].x, (unsigned int)int8_int8[i].y, int8_int8[i].fExpected );
		}
	}
}